

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O1

void TestEnergyConservation
               (function<pbrt::BSDF_*(const_pbrt::SurfaceInteraction_&,_pstd::pmr::polymorphic_allocator<std::byte>)>
                *createBSDF,char *description)

{
  undefined1 *puVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  byte bVar13;
  undefined1 auVar14 [16];
  bool bVar15;
  int i;
  int iVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var18;
  BSDF *this;
  long lVar19;
  size_t sVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  char *pcVar25;
  bool *__args_2;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  undefined1 auVar33 [16];
  float fVar31;
  float fVar32;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  float fVar38;
  undefined4 uVar39;
  float fVar43;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 in_XMM6 [16];
  Vector3f woRender;
  AssertHelper in_stack_fffffffffffffdc8;
  AssertHelper AVar44;
  AssertHelper AVar45;
  AssertHelper AVar46;
  bool reverseOrientation;
  undefined1 local_229;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_228;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_220;
  optional<pbrt::BSDFSample> bs;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  shared_ptr<pbrt::Disk> disk;
  optional<pbrt::ShapeIntersection> si;
  Ray local_58;
  
  uVar21 = (uint)((ulong)in_stack_fffffffffffffdc8.data_ >> 0x20);
  pbrt::RotateX((Transform *)&si,-90.0);
  p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x90);
  p_Var17->_M_use_count = 1;
  p_Var17->_M_weak_count = 1;
  p_Var17->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_02ef7930;
  p_Var17[1]._vptr__Sp_counted_base = (_func_int **)si.optionalValue.__align;
  p_Var17[1]._M_use_count = si.optionalValue._8_4_;
  p_Var17[1]._M_weak_count = si.optionalValue._12_4_;
  p_Var17[2]._vptr__Sp_counted_base = (_func_int **)si.optionalValue._16_8_;
  p_Var17[2]._M_use_count = si.optionalValue._24_4_;
  p_Var17[2]._M_weak_count = si.optionalValue._28_4_;
  p_Var17[3]._vptr__Sp_counted_base = (_func_int **)si.optionalValue._32_8_;
  p_Var17[3]._M_use_count = si.optionalValue._40_4_;
  p_Var17[3]._M_weak_count = si.optionalValue._44_4_;
  p_Var17[4]._vptr__Sp_counted_base = (_func_int **)si.optionalValue._48_8_;
  p_Var17[4]._M_use_count = si.optionalValue._56_4_;
  p_Var17[4]._M_weak_count = si.optionalValue._60_4_;
  p_Var17[5]._vptr__Sp_counted_base = (_func_int **)si.optionalValue._64_8_;
  p_Var17[5]._M_use_count = si.optionalValue._72_4_;
  p_Var17[5]._M_weak_count = si.optionalValue._76_4_;
  p_Var17[6]._vptr__Sp_counted_base = (_func_int **)si.optionalValue._80_8_;
  p_Var17[6]._M_use_count = si.optionalValue._88_4_;
  p_Var17[6]._M_weak_count = si.optionalValue._92_4_;
  p_Var17[7]._vptr__Sp_counted_base = (_func_int **)si.optionalValue._96_8_;
  p_Var17[7]._M_use_count = si.optionalValue._104_4_;
  p_Var17[7]._M_weak_count = si.optionalValue._108_4_;
  p_Var17[8]._vptr__Sp_counted_base = (_func_int **)si.optionalValue._112_8_;
  p_Var17[8]._M_use_count = si.optionalValue._120_4_;
  p_Var17[8]._M_weak_count = si.optionalValue._124_4_;
  si.optionalValue.__align = (anon_struct_8_0_00000001_for___align)p_Var17[5]._vptr__Sp_counted_base
  ;
  si.optionalValue._8_4_ = p_Var17[5]._M_use_count;
  si.optionalValue._12_4_ = p_Var17[5]._M_weak_count;
  si.optionalValue._16_8_ = p_Var17[6]._vptr__Sp_counted_base;
  si.optionalValue._24_4_ = p_Var17[6]._M_use_count;
  si.optionalValue._28_4_ = p_Var17[6]._M_weak_count;
  si.optionalValue._32_8_ = p_Var17[7]._vptr__Sp_counted_base;
  si.optionalValue._40_4_ = p_Var17[7]._M_use_count;
  si.optionalValue._44_4_ = p_Var17[7]._M_weak_count;
  si.optionalValue._48_8_ = p_Var17[8]._vptr__Sp_counted_base;
  si.optionalValue._56_4_ = p_Var17[8]._M_use_count;
  si.optionalValue._60_4_ = p_Var17[8]._M_weak_count;
  si.optionalValue._64_8_ = p_Var17[1]._vptr__Sp_counted_base;
  si.optionalValue._72_4_ = p_Var17[1]._M_use_count;
  si.optionalValue._76_4_ = p_Var17[1]._M_weak_count;
  si.optionalValue._80_8_ = p_Var17[2]._vptr__Sp_counted_base;
  si.optionalValue._88_4_ = p_Var17[2]._M_use_count;
  si.optionalValue._92_4_ = p_Var17[2]._M_weak_count;
  si.optionalValue._96_8_ = p_Var17[3]._vptr__Sp_counted_base;
  si.optionalValue._104_4_ = p_Var17[3]._M_use_count;
  si.optionalValue._108_4_ = p_Var17[3]._M_weak_count;
  si.optionalValue._112_8_ = p_Var17[4]._vptr__Sp_counted_base;
  si.optionalValue._120_4_ = p_Var17[4]._M_use_count;
  si.optionalValue._124_4_ = p_Var17[4]._M_weak_count;
  p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x90);
  p_Var18->_M_use_count = 1;
  p_Var18->_M_weak_count = 1;
  p_Var18->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_02ef7930;
  bs.optionalValue._0_8_ = p_Var18 + 1;
  auVar37._8_8_ = si.optionalValue._72_8_;
  auVar37._0_8_ = si.optionalValue._64_8_;
  auVar37._16_8_ = si.optionalValue._80_8_;
  auVar37._24_8_ = si.optionalValue._88_8_;
  auVar37._32_8_ = si.optionalValue._96_8_;
  auVar37._40_8_ = si.optionalValue._104_8_;
  auVar37._48_8_ = si.optionalValue._112_8_;
  auVar37._56_8_ = si.optionalValue._120_8_;
  p_Var18[1]._vptr__Sp_counted_base = (_func_int **)si.optionalValue.__align;
  p_Var18[1]._M_use_count = si.optionalValue._8_4_;
  p_Var18[1]._M_weak_count = si.optionalValue._12_4_;
  p_Var18[2]._vptr__Sp_counted_base = (_func_int **)si.optionalValue._16_8_;
  p_Var18[2]._M_use_count = si.optionalValue._24_4_;
  p_Var18[2]._M_weak_count = si.optionalValue._28_4_;
  p_Var18[3]._vptr__Sp_counted_base = (_func_int **)si.optionalValue._32_8_;
  p_Var18[3]._M_use_count = si.optionalValue._40_4_;
  p_Var18[3]._M_weak_count = si.optionalValue._44_4_;
  p_Var18[4]._vptr__Sp_counted_base = (_func_int **)si.optionalValue._48_8_;
  p_Var18[4]._M_use_count = si.optionalValue._56_4_;
  p_Var18[4]._M_weak_count = si.optionalValue._60_4_;
  *(undefined1 (*) [64])(p_Var18 + 5) = auVar37;
  __args_2 = &reverseOrientation;
  reverseOrientation = false;
  local_58.o.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_58.o.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  gtest_ar_._0_8_ = 0x3ff0000000000000;
  AVar46.data_ = (AssertHelperData *)((ulong)uVar21 << 0x20);
  gtest_ar._0_8_ = &DAT_4076800000000000;
  disk.super___shared_ptr<pbrt::Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  si.optionalValue.__align = (anon_struct_8_0_00000001_for___align)(p_Var17 + 1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pbrt::Disk,std::allocator<pbrt::Disk>,pbrt::Transform_const*,pbrt::Transform_const*,bool&,double,double,int,double>
            (&disk.super___shared_ptr<pbrt::Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (Disk **)&disk,(allocator<pbrt::Disk> *)&local_229,(Transform **)&si,(Transform **)&bs,
             __args_2,(double *)&local_58,(double *)&gtest_ar_,(int *)&stack0xfffffffffffffdc8,
             (double *)&gtest_ar);
  local_58.o.super_Tuple3<pbrt::Point3,_float>.x = 0.1;
  local_58.o.super_Tuple3<pbrt::Point3,_float>.y = 1.0;
  local_58.o.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_58.d.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  local_58.d.super_Tuple3<pbrt::Vector3,_float>.y = -1.0;
  local_58.d.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  local_58.time = 0.0;
  local_58.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           )0;
  pbrt::Disk::Intersect
            (&si,disk.super___shared_ptr<pbrt::Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_58,
             INFINITY);
  gtest_ar_.success_ = si.set;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  local_228 = p_Var18;
  local_220 = p_Var17;
  if (si.set == false) {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&bs,(internal *)&gtest_ar_,(AssertionResult *)"si.has_value()","false",
               "true",__args_2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffdc8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bsdfs_test.cpp"
               ,0x1ee,(char *)bs.optionalValue._0_8_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffdc8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffdc8);
    if ((undefined1 *)bs.optionalValue._0_8_ != (undefined1 *)((long)&bs.optionalValue + 0x10)) {
      operator_delete((void *)bs.optionalValue._0_8_,
                      CONCAT44(bs.optionalValue._20_4_,bs.optionalValue._16_4_) + 1);
    }
    if (gtest_ar._0_8_ != 0) {
      bVar15 = testing::internal::IsTrue(true);
      if ((bVar15) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (si.set == false) {
      pbrt::LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
    }
    bs.optionalValue._0_8_ = pstd::pmr::new_delete_resource();
    if ((createBSDF->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    this = (*createBSDF->_M_invoker)
                     ((_Any_data *)createBSDF,(SurfaceInteraction *)&si,
                      (polymorphic_allocator<std::byte> *)&bs);
    puVar1 = (undefined1 *)((long)&bs.optionalValue + 0x10);
    uVar23 = 0x853c49e6748fea9b;
    iVar16 = 0;
    do {
      uVar24 = uVar23 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = uVar23;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = uVar24;
      auVar33 = vpunpcklqdq_avx(auVar40,auVar29);
      auVar28 = vpsrlvq_avx2(auVar33,_DAT_005655d0);
      auVar29 = vpsrlvq_avx2(auVar33,_DAT_005655c0);
      auVar28 = vpshufd_avx(auVar29 ^ auVar28,0xe8);
      auVar33 = vpsrlq_avx(auVar33,0x3b);
      auVar33 = vpshufd_avx(auVar33,0xe8);
      auVar28 = vprorvd_avx512vl(auVar28,auVar33);
      auVar33 = vcvtudq2ps_avx512vl(auVar28);
      auVar28._8_4_ = 0x2f800000;
      auVar28._0_8_ = 0x2f8000002f800000;
      auVar28._12_4_ = 0x2f800000;
      auVar29 = vmulps_avx512vl(auVar33,auVar28);
      auVar33._8_4_ = 0x3f7fffff;
      auVar33._0_8_ = 0x3f7fffff3f7fffff;
      auVar33._12_4_ = 0x3f7fffff;
      uVar23 = vcmpps_avx512vl(auVar29,auVar33,1);
      bVar13 = (byte)(uVar23 >> 1);
      auVar28 = vmovshdup_avx(auVar29);
      fVar26 = (float)((uint)(bVar13 & 1) * auVar28._0_4_ + (uint)!(bool)(bVar13 & 1) * 0x3f7fffff);
      auVar41._0_12_ = ZEXT812(0);
      auVar41._12_4_ = 0;
      auVar28 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar26 * fVar26)),auVar41);
      if (auVar28._0_4_ < 0.0) {
        fVar30 = sqrtf(auVar28._0_4_);
      }
      else {
        auVar28 = vsqrtss_avx(auVar28,auVar28);
        fVar30 = auVar28._0_4_;
      }
      fVar27 = (float)((uint)((byte)uVar23 & 1) * (int)(auVar29._0_4_ * 6.2831855) +
                      (uint)!(bool)((byte)uVar23 & 1) * 0x40c90fda);
      fVar31 = cosf(fVar27);
      fVar31 = fVar31 * fVar30;
      fVar32 = sinf(fVar27);
      fVar32 = fVar32 * fVar30;
      uVar3 = (this->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.x;
      uVar6 = (this->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.y;
      uVar4 = (this->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.x;
      uVar7 = (this->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.y;
      uVar5 = (this->shadingFrame).z.super_Tuple3<pbrt::Vector3,_float>.x;
      uVar8 = (this->shadingFrame).z.super_Tuple3<pbrt::Vector3,_float>.y;
      fVar38 = fVar31 * (float)uVar3 + fVar32 * (float)uVar4 + fVar26 * (float)uVar5;
      fVar43 = fVar31 * (float)uVar6 + fVar32 * (float)uVar7 + fVar26 * (float)uVar8;
      fVar30 = (this->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.z;
      fVar27 = (this->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.z;
      fVar2 = (this->shadingFrame).z.super_Tuple3<pbrt::Vector3,_float>.z;
      gtest_ar_._0_12_ = ZEXT812(0);
      gtest_ar_.message_.ptr_._4_4_ = 0.0;
      uVar23 = uVar24 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      iVar22 = 0x4000;
      do {
        uVar21 = (uint)(uVar23 >> 0x2d) ^ (uint)(uVar23 >> 0x1b);
        bVar13 = (byte)(uVar23 >> 0x3b);
        auVar28 = vcvtusi2ss_avx512f(in_XMM6,uVar21 >> bVar13 | uVar21 << 0x20 - bVar13);
        auVar28 = vminss_avx(ZEXT416((uint)(auVar28._0_4_ * 2.3283064e-10)),
                             SUB6416(ZEXT464(0x3f7fffff),0));
        uVar23 = uVar23 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
        uVar24 = uVar23 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = uVar23;
        auVar42._8_8_ = 0;
        auVar42._0_8_ = uVar24;
        auVar29 = vpunpcklqdq_avx(auVar34,auVar42);
        auVar33 = vpsrlvq_avx2(auVar29,_DAT_005655c0);
        auVar40 = vpsrlvq_avx2(auVar29,_DAT_005655d0);
        auVar33 = vpshufd_avx(auVar33 ^ auVar40,0xe8);
        auVar29 = vpsrlq_avx(auVar29,0x3b);
        auVar29 = vpshufd_avx(auVar29,0xe8);
        auVar33 = vprorvd_avx512vl(auVar33,auVar29);
        auVar33 = vcvtudq2ps_avx512vl(auVar33);
        auVar9._8_4_ = 0x2f800000;
        auVar9._0_8_ = 0x2f8000002f800000;
        auVar9._12_4_ = 0x2f800000;
        auVar33 = vmulps_avx512vl(auVar33,auVar9);
        auVar10._8_4_ = 0x3f7fffff;
        auVar10._0_8_ = 0x3f7fffff3f7fffff;
        auVar10._12_4_ = 0x3f7fffff;
        auVar33 = vminps_avx512vl(auVar33,auVar10);
        woRender.super_Tuple3<pbrt::Vector3,_float>.y = fVar43;
        woRender.super_Tuple3<pbrt::Vector3,_float>.x = fVar38;
        woRender.super_Tuple3<pbrt::Vector3,_float>.z =
             fVar31 * fVar30 + fVar32 * fVar27 + fVar26 * fVar2;
        pbrt::BSDF::Sample_f(&bs,this,woRender,auVar28._0_4_,(Point2f)auVar33._0_8_,Radiance,All);
        if (bs.set == true) {
          if (si.set == false) {
            pbrt::LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
          }
          auVar28 = vfmadd132ss_fma(ZEXT416((uint)si.optionalValue._44_4_),
                                    ZEXT416((uint)((float)si.optionalValue._48_4_ *
                                                  (float)bs.optionalValue._24_4_)),
                                    ZEXT416((uint)bs.optionalValue._20_4_));
          auVar33 = vfmsub213ss_fma(ZEXT416((uint)bs.optionalValue._24_4_),
                                    ZEXT416((uint)si.optionalValue._48_4_),
                                    ZEXT416((uint)((float)si.optionalValue._48_4_ *
                                                  (float)bs.optionalValue._24_4_)));
          auVar28 = vfmadd231ss_fma(ZEXT416((uint)(auVar28._0_4_ + auVar33._0_4_)),
                                    ZEXT416((uint)si.optionalValue._40_4_),
                                    ZEXT416((uint)bs.optionalValue._16_4_));
          uVar39 = auVar28._0_4_;
          auVar35._4_4_ = uVar39;
          auVar35._0_4_ = uVar39;
          auVar35._8_4_ = uVar39;
          auVar35._12_4_ = uVar39;
          auVar11._8_4_ = 0x7fffffff;
          auVar11._0_8_ = 0x7fffffff7fffffff;
          auVar11._12_4_ = 0x7fffffff;
          auVar28 = vandps_avx512vl(auVar35,auVar11);
          auVar36._0_4_ = auVar28._0_4_ * (float)bs.optionalValue.__align;
          auVar36._4_4_ = auVar28._4_4_ * (float)bs.optionalValue._4_4_;
          auVar36._8_4_ = auVar28._8_4_ * (float)bs.optionalValue._8_4_;
          auVar36._12_4_ = auVar28._12_4_ * (float)bs.optionalValue._12_4_;
          auVar12._4_4_ = bs.optionalValue._28_4_;
          auVar12._0_4_ = bs.optionalValue._28_4_;
          auVar12._8_4_ = bs.optionalValue._28_4_;
          auVar12._12_4_ = bs.optionalValue._28_4_;
          auVar28 = vdivps_avx512vl(auVar36,auVar12);
          gtest_ar_._4_4_ = auVar28._4_4_ + (float)gtest_ar_._4_4_;
          gtest_ar_._0_4_ = auVar28._0_4_ + (float)gtest_ar_._0_4_;
          gtest_ar_.message_.ptr_._0_4_ = auVar28._8_4_ + gtest_ar_.message_.ptr_._0_4_;
          gtest_ar_.message_.ptr_._4_4_ = auVar28._12_4_ + gtest_ar_.message_.ptr_._4_4_;
          bs.set = false;
        }
        uVar23 = uVar24 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
        iVar22 = iVar22 + -1;
      } while (iVar22 != 0);
      gtest_ar_._0_4_ = (float)gtest_ar_._0_4_ * 6.1035156e-05;
      gtest_ar_._4_4_ = (float)gtest_ar_._4_4_ * 6.1035156e-05;
      gtest_ar_.message_.ptr_._0_4_ = gtest_ar_.message_.ptr_._0_4_ * 6.1035156e-05;
      gtest_ar_.message_.ptr_._4_4_ = gtest_ar_.message_.ptr_._4_4_ * 6.1035156e-05;
      lVar19 = 1;
      auVar37 = ZEXT464((uint)gtest_ar_._0_4_);
      do {
        auVar28 = vmaxss_avx(ZEXT416(*(uint *)(&gtest_ar_.success_ + lVar19 * 4)),auVar37._0_16_);
        auVar37 = ZEXT1664(auVar28);
        lVar19 = lVar19 + 1;
      } while (lVar19 != 4);
      AVar46.data_._4_4_ = (undefined4)((ulong)AVar46.data_ >> 0x20);
      AVar46.data_._0_4_ = auVar28._0_4_;
      bs.optionalValue._0_8_ = &DAT_3ff028f5c28f5c29;
      testing::internal::CmpHelperLT<float,double>
                ((internal *)&gtest_ar,"Lo.MaxComponentValue()","1.01",
                 (float *)&stack0xfffffffffffffdc8,(double *)&bs);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&stack0xfffffffffffffdc8);
        AVar44.data_ = AVar46.data_;
        if (description == (char *)0x0) {
          sVar20 = 6;
          pcVar25 = "(null)";
        }
        else {
          sVar20 = strlen(description);
          pcVar25 = description;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(AVar46.data_)->line,pcVar25,sVar20);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(AVar44.data_)->line,": Lo = ",7);
        AVar45.data_ = AVar44.data_;
        pbrt::SampledSpectrum::ToString_abi_cxx11_((string *)&bs,(SampledSpectrum *)&gtest_ar_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(AVar44.data_)->line,(char *)bs.optionalValue._0_8_,
                   CONCAT44(bs.optionalValue._12_4_,bs.optionalValue._8_4_));
        if ((undefined1 *)bs.optionalValue._0_8_ != puVar1) {
          operator_delete((void *)bs.optionalValue._0_8_,
                          CONCAT44(bs.optionalValue._20_4_,bs.optionalValue._16_4_) + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(AVar45.data_)->line,", wo = ",7);
        auVar14._4_4_ = fVar43;
        auVar14._0_4_ = fVar38;
        auVar14._8_4_ = fVar31 * 0.0 + fVar32 * 0.0 + fVar26 * 0.0;
        auVar14._12_4_ = fVar31 * 0.0 + fVar32 * 0.0 + fVar26 * 0.0;
        vmovshdup_avx(auVar14);
        AVar46.data_ = AVar45.data_;
        pbrt::internal::ToString3<float>
                  ((float)((ulong)AVar45.data_ >> 0x20),SUB84(AVar45.data_,0),0.0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(AVar45.data_)->line,(char *)bs.optionalValue._0_8_,
                   CONCAT44(bs.optionalValue._12_4_,bs.optionalValue._8_4_));
        if ((undefined1 *)bs.optionalValue._0_8_ != puVar1) {
          operator_delete((void *)bs.optionalValue._0_8_,
                          CONCAT44(bs.optionalValue._20_4_,bs.optionalValue._16_4_) + 1);
        }
        pcVar25 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar25 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&bs,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bsdfs_test.cpp"
                   ,0x201,pcVar25);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&bs,(Message *)&stack0xfffffffffffffdc8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bs);
        if (AVar46.data_ != (AssertHelperData *)0x0) {
          bVar15 = testing::internal::IsTrue(true);
          if ((bVar15) && (AVar46.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)AVar46.data_ + 8))();
          }
          AVar46.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      iVar16 = iVar16 + 1;
    } while (iVar16 != 10);
  }
  p_Var18 = local_220;
  p_Var17 = local_228;
  if (si.set == true) {
    si.set = false;
  }
  if (disk.super___shared_ptr<pbrt::Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (disk.super___shared_ptr<pbrt::Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
  return;
}

Assistant:

static void TestEnergyConservation(
    std::function<BSDF*(const SurfaceInteraction&, Allocator)> createBSDF,
    const char* description) {
    RNG rng;

    // Create BSDF, which requires creating a Shape, casting a Ray that
    // hits the shape to get a SurfaceInteraction object.
    auto t = std::make_shared<const Transform>(RotateX(-90));
    auto tInv = std::make_shared<const Transform>(Inverse(*t));

    bool reverseOrientation = false;
    std::shared_ptr<Disk> disk =
        std::make_shared<Disk>(t.get(), tInv.get(), reverseOrientation, 0., 1., 0, 360.);
    Point3f origin(0.1, 1,
                   0);  // offset slightly so we don't hit center of disk
    Vector3f direction(0, -1, 0);
    Ray r(origin, direction);
    auto si = disk->Intersect(r);
    ASSERT_TRUE(si.has_value());
    BSDF* bsdf = createBSDF(si->intr, Allocator());

    for (int i = 0; i < 10; ++i) {
        Point2f uo{rng.Uniform<Float>(), rng.Uniform<Float>()};
        Vector3f woL = SampleUniformHemisphere(uo);
        Vector3f wo = bsdf->LocalToRender(woL);

        const int nSamples = 16384;
        SampledSpectrum Lo(0.f);
        for (int j = 0; j < nSamples; ++j) {
            Float u = rng.Uniform<Float>();
            Point2f ui{rng.Uniform<Float>(), rng.Uniform<Float>()};
            pstd::optional<BSDFSample> bs = bsdf->Sample_f(wo, u, ui);
            if (bs)
                Lo += bs->f * AbsDot(bs->wi, si->intr.n) / bs->pdf;
        }
        Lo /= nSamples;

        EXPECT_LT(Lo.MaxComponentValue(), 1.01)
            << description << ": Lo = " << Lo << ", wo = " << wo;
    }
}